

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formula.hpp
# Opt level: O3

void __thiscall Excel::Formula::Formula(Formula *this,Record *record)

{
  ValueType VVar1;
  ulong uVar2;
  RecordSubstream *this_00;
  anon_union_8_2_91d51eec doubleAsLongLong;
  double local_20;
  
  this->m_valueType = UnknownValue;
  this->m_doubleValue = 0.0;
  this->m_errorValue = UnknownError;
  this->m_boolValue = false;
  (this->m_stringValue)._M_dataplus._M_p = (pointer)&(this->m_stringValue).field_2;
  (this->m_stringValue)._M_string_length = 0;
  (this->m_stringValue).field_2._M_local_buf[0] = L'\0';
  this->m_row = 0;
  this->m_column = 0;
  this_00 = &record->m_stream;
  Stream::read<short>(&this_00->super_Stream,&this->m_row,2);
  Stream::read<short>(&this_00->super_Stream,&this->m_column,2);
  (*(this_00->super_Stream)._vptr_Stream[4])(this_00,2,1);
  Stream::read<long>(&this_00->super_Stream,(long *)&local_20,8);
  uVar2 = (ulong)local_20 & 0xffffffffff00ffff;
  if (uVar2 == 0xffff000000000003) {
    VVar1 = EmptyCell;
  }
  else if (uVar2 == 0xffff000000000002) {
    this->m_errorValue = (ErrorValues)((ulong)local_20 >> 0x10);
    VVar1 = ErrorValue;
  }
  else if (uVar2 == 0xffff000000000001) {
    this->m_boolValue = ((ulong)local_20 & 0xff0000) != 0;
    VVar1 = BooleanValue;
  }
  else {
    VVar1 = StringValue;
    if (local_20 != -NAN) {
      this->m_doubleValue = local_20;
      VVar1 = DoubleValue;
    }
  }
  this->m_valueType = VVar1;
  return;
}

Assistant:

inline
Formula::Formula( Record & record )
	:	m_valueType( UnknownValue )
	,	m_doubleValue( 0.0 )
	,	m_errorValue( UnknownError )
	,	m_boolValue( false )
	,	m_row( 0 )
	,	m_column( 0 )
{
	parse( record );
}